

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O2

int IDASensEwtSet(IDAMem IDA_mem,N_Vector *yScur,N_Vector *weightS)

{
  N_Vector p_Var1;
  int iVar2;
  long lVar3;
  int is;
  double dVar4;
  
  iVar2 = IDA_mem->ida_itolS;
  if (iVar2 == 1) {
    for (lVar3 = 0; lVar3 < IDA_mem->ida_Ns; lVar3 = lVar3 + 1) {
      N_VAbs(yScur[lVar3],IDA_mem->ida_tempv1);
      N_VScale(IDA_mem->ida_rtolS,IDA_mem->ida_tempv1,IDA_mem->ida_tempv1);
      N_VAddConst(IDA_mem->ida_SatolS[lVar3],IDA_mem->ida_tempv1,IDA_mem->ida_tempv1);
      if ((IDA_mem->ida_atolSmin0[lVar3] != 0) &&
         (dVar4 = (double)N_VMin(IDA_mem->ida_tempv1), dVar4 <= 0.0)) {
        return -1;
      }
      N_VInv(IDA_mem->ida_tempv1,weightS[lVar3]);
    }
  }
  else if (iVar2 == 2) {
    for (lVar3 = 0; lVar3 < IDA_mem->ida_Ns; lVar3 = lVar3 + 1) {
      N_VAbs(yScur[lVar3],IDA_mem->ida_tempv1);
      N_VLinearSum(IDA_mem->ida_rtolS,IDA_mem->ida_tempv1,IDA_mem->ida_VatolS[lVar3],
                   IDA_mem->ida_tempv1);
      if ((IDA_mem->ida_atolSmin0[lVar3] != 0) &&
         (dVar4 = (double)N_VMin(IDA_mem->ida_tempv1), dVar4 <= 0.0)) {
        return -1;
      }
      N_VInv(IDA_mem->ida_tempv1,weightS[lVar3]);
    }
  }
  else if (iVar2 == 4) {
    p_Var1 = IDA_mem->ida_tempv1;
    for (lVar3 = 0; lVar3 < IDA_mem->ida_Ns; lVar3 = lVar3 + 1) {
      N_VScale(IDA_mem->ida_pbar[lVar3],yScur[lVar3],p_Var1);
      iVar2 = (*IDA_mem->ida_efun)(p_Var1,weightS[lVar3],IDA_mem->ida_edata);
      if (iVar2 != 0) {
        return -1;
      }
      N_VScale(IDA_mem->ida_pbar[lVar3],weightS[lVar3],weightS[lVar3]);
    }
  }
  return 0;
}

Assistant:

int IDASensEwtSet(IDAMem IDA_mem, N_Vector* yScur, N_Vector* weightS)
{
  int flag = 0;

  switch (IDA_mem->ida_itolS)
  {
  case IDA_EE: flag = IDASensEwtSetEE(IDA_mem, yScur, weightS); break;
  case IDA_SS: flag = IDASensEwtSetSS(IDA_mem, yScur, weightS); break;
  case IDA_SV: flag = IDASensEwtSetSV(IDA_mem, yScur, weightS); break;
  }

  return (flag);
}